

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O2

bsc_group_t bsc_group_create_neighbourhood(bsc_pid_t *neighbours,bsc_size_t size)

{
  int iVar1;
  uint uVar2;
  bsp_pid_t bVar3;
  undefined4 extraout_var;
  void *pvVar4;
  void *__ptr;
  group_t *g;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int members;
  undefined4 in_register_00000034;
  ulong uVar8;
  bsc_size_t bVar9;
  ulong uVar10;
  bsc_size_t offset;
  void *local_40;
  ulong local_38;
  
  local_38 = CONCAT44(in_register_00000034,size);
  uVar2 = bsp_nprocs();
  uVar6 = (ulong)uVar2;
  bVar3 = bsp_pid();
  pvVar4 = calloc((long)(int)uVar2,4);
  __ptr = calloc((long)(int)uVar2,4);
  g = (group_t *)calloc(1,0x20);
  if ((__ptr == (void *)0x0 || pvVar4 == (void *)0x0) || g == (group_t *)0x0) {
    bsp_abort("bsc_group_create_neighbourhood: Insufficient memory");
  }
  local_40 = pvVar4;
  bsp_push_reg(pvVar4,uVar2 * 4);
  bsp_sync();
  uVar10 = 0;
  uVar5 = local_38 & 0xffffffff;
  if ((int)local_38 < 1) {
    uVar5 = uVar10;
  }
  while (uVar5 != uVar10) {
    bVar9 = (bsc_size_t)(uVar10 + 1);
    offset = bVar9;
    bsp_put(neighbours[uVar10],&offset,local_40,bVar3 * 4,4);
    *(bsc_size_t *)((long)__ptr + (long)neighbours[uVar10] * 4) = bVar9;
    uVar10 = uVar10 + 1;
  }
  bsp_sync();
  if (*(int *)((long)__ptr + (long)bVar3 * 4) == 0) {
    bsp_abort("bsc_group_create_neighbourhood: Group must include calling process");
  }
  pvVar4 = local_40;
  if ((int)uVar2 < 1) {
    uVar6 = 0;
  }
  uVar10 = 0;
  members = 0;
  do {
    if (uVar6 == uVar10) {
      group_create(g,members);
      for (uVar10 = 0; uVar6 != uVar10; uVar10 = uVar10 + 1) {
        g->lid[uVar10] = -1;
      }
      for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
        g->lid[neighbours[uVar6]] = (bsp_pid_t)uVar6;
        g->rof[uVar6] = *(int *)((long)pvVar4 + (long)neighbours[uVar6] * 4) + -1;
        g->gid[uVar6] = neighbours[uVar6];
      }
      bsp_pop_reg(pvVar4);
      bsp_sync();
      free(pvVar4);
      free(__ptr);
      return g;
    }
    iVar1 = *(int *)((long)__ptr + uVar10 * 4);
    if (*(int *)((long)pvVar4 + uVar10 * 4) == 0) {
      if (iVar1 != 0) {
        uVar7 = uVar10 & 0xffffffff;
        uVar8 = CONCAT44(extraout_var,bVar3);
        goto LAB_001136de;
      }
    }
    else if (iVar1 == 0) {
      uVar7 = CONCAT44(extraout_var,bVar3);
      uVar8 = uVar10 & 0xffffffff;
LAB_001136de:
      bsp_abort("bsc_group_create_neighourhood: Processes %d thinks %d is a neighbour, but that feeling is not mutual\n"
                ,uVar8,uVar7);
    }
    else {
      members = members + 1;
    }
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

bsc_group_t bsc_group_create_neighbourhood( bsc_pid_t * neighbours, 
        bsc_size_t size )
{
    bsc_pid_t i, P = bsp_nprocs(), s = bsp_pid();
    bsc_pid_t n_members = 0;
    bsc_size_t * incoming = calloc( P, sizeof(incoming[0]));
    bsc_size_t * outgoing = calloc( P, sizeof(outgoing[0]));
    group_t * g = calloc( 1, sizeof(*g) );
    if (!incoming || !outgoing || !g)
        bsp_abort("bsc_group_create_neighbourhood: Insufficient memory");
    bsp_push_reg( incoming, P*sizeof(incoming[0]) );
    bsp_sync();

    /* fill the communication matrix with a 1 for each connection */
    for ( i = 0 ; i < size ; ++i ) {
        bsc_size_t offset = i+1;
        bsp_put( neighbours[i], &offset, incoming, s*sizeof(offset), sizeof(offset) );
        outgoing[ neighbours[i] ] = i+1 ;
    }
    bsp_sync();

    if ( !outgoing[s] )
        bsp_abort("bsc_group_create_neighbourhood: Group must include calling process");

    /* take the intersection of incoming and outgoing */
    for ( i = 0; i < P; ++i ) {
        if (incoming[i] && !outgoing[i])  {
            bsp_abort("bsc_group_create_neighourhood: Processes %d thinks %d"
                    " is a neighbour, but that feeling is not mutual\n",
                    i, s );
        }
        else if (!incoming[i] && outgoing[i]) {
            bsp_abort("bsc_group_create_neighourhood: Processes %d thinks %d"
                    " is a neighbour, but that feeling is not mutual\n",
                    s, i );
        }
        else if (incoming[i] && outgoing[i])
            n_members += 1;
    }

    group_create( g, n_members );
    for ( i = 0; i < P; ++i )
        g->lid[i] = -1;

    for ( i = 0; i < size; ++i ) {
        g->lid[ neighbours[i] ] = i;
        g->rof[ i ] = incoming[ neighbours[i] ] - 1;
        g->gid[ i ] = neighbours[i];
    }

    bsp_pop_reg(incoming);
    bsp_sync();
    free(incoming);
    free(outgoing);

    return g;
}